

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O3

void __thiscall OpenMD::Integrator::~Integrator(Integrator *this)

{
  Rattle *this_00;
  DumpWriter *this_01;
  StatWriter *this_02;
  ProgressBar *pPVar1;
  RNEMD *pRVar2;
  Velocitizer *pVVar3;
  
  this->_vptr_Integrator = (_func_int **)&PTR__Integrator_002fbd28;
  if (this->forceMan_ != (ForceManager *)0x0) {
    (*this->forceMan_->_vptr_ForceManager[1])();
  }
  if (this->flucQ_ != (FluctuatingChargePropagator *)0x0) {
    (*this->flucQ_->_vptr_FluctuatingChargePropagator[1])();
  }
  if (this->rotAlgo_ != (RotationAlgorithm *)0x0) {
    (*this->rotAlgo_->_vptr_RotationAlgorithm[1])();
  }
  this_00 = this->rattle_;
  if (this_00 != (Rattle *)0x0) {
    Rattle::~Rattle(this_00);
  }
  operator_delete(this_00,0x68);
  this_01 = this->dumpWriter;
  if (this_01 != (DumpWriter *)0x0) {
    DumpWriter::~DumpWriter(this_01);
  }
  operator_delete(this_01,0x60);
  if (this->stats != (Stats *)0x0) {
    (*this->stats->_vptr_Stats[1])();
  }
  this_02 = this->statWriter;
  if (this_02 != (StatWriter *)0x0) {
    StatWriter::~StatWriter(this_02);
  }
  operator_delete(this_02,0x448);
  pPVar1 = (this->progressBar)._M_t.
           super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>.
           super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl;
  if (pPVar1 != (ProgressBar *)0x0) {
    operator_delete(pPVar1,0x20);
  }
  (this->progressBar)._M_t.
  super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>.
  super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl = (ProgressBar *)0x0;
  pRVar2 = (this->rnemd_)._M_t.
           super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
           .super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl;
  if (pRVar2 != (RNEMD *)0x0) {
    (*pRVar2->_vptr_RNEMD[1])();
  }
  (this->rnemd_)._M_t.
  super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>.
  super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl = (RNEMD *)0x0;
  pVVar3 = (this->velocitizer_)._M_t.
           super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
           super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl;
  if (pVVar3 != (Velocitizer *)0x0) {
    (*pVVar3->_vptr_Velocitizer[1])();
  }
  (this->velocitizer_)._M_t.
  super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
  super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl = (Velocitizer *)0x0;
  return;
}

Assistant:

Integrator::~Integrator() {
    delete forceMan_;
    delete flucQ_;
    delete rotAlgo_;
    delete rattle_;
    delete dumpWriter;
    delete stats;
    delete statWriter;
  }